

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

void __thiscall CGameConsole::CInstance::OnInput(CInstance *this,CEvent Event)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  IClient *pIVar7;
  IInput *pIVar8;
  undefined4 extraout_var;
  CInstance *in_RDI;
  long in_FS_OFFSET;
  bool bVar9;
  uint in_stack_00000008;
  int in_stack_0000000c;
  CCommandInfo *pCommand;
  int i_1;
  char *pSrc;
  uint i;
  int CompletionMapEnumerationCount;
  int CompletionEnumerationCount;
  bool UseTempCommands;
  int Direction;
  char *pTest;
  char *pEntry;
  bool Handled;
  char aBuf [48];
  char *in_stack_ffffffffffffff18;
  IConsole *pIVar10;
  CInstance *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined2 in_stack_ffffffffffffff2c;
  undefined1 in_stack_ffffffffffffff2e;
  byte bVar11;
  undefined1 in_stack_ffffffffffffff2f;
  undefined6 in_stack_ffffffffffffff48;
  byte in_stack_ffffffffffffff4e;
  byte in_stack_ffffffffffffff4f;
  CLineInput *in_stack_ffffffffffffff50;
  int local_7c;
  char *local_78;
  uint local_6c;
  char local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar9 = false;
  if ((in_stack_00000008 & 1) == 0) goto LAB_00155abd;
  if ((in_stack_0000000c != 0xd) && (in_stack_0000000c != 0xd8)) {
    if (in_stack_0000000c == 0xd2) {
      if (in_RDI->m_pHistoryEntry == (char *)0x0) {
        pcVar6 = TStaticRingBuffer<char,_65536,_1>::Last
                           ((TStaticRingBuffer<char,_65536,_1> *)0x15562c);
        in_RDI->m_pHistoryEntry = pcVar6;
      }
      else {
        pcVar6 = TStaticRingBuffer<char,_65536,_1>::Prev
                           ((TStaticRingBuffer<char,_65536,_1> *)in_stack_ffffffffffffff20,
                            in_stack_ffffffffffffff18);
        if (pcVar6 != (char *)0x0) {
          in_RDI->m_pHistoryEntry = pcVar6;
        }
      }
      if (in_RDI->m_pHistoryEntry != (char *)0x0) {
        CLineInput::Set((CLineInput *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      }
      bVar9 = true;
      goto LAB_00155abd;
    }
    if (in_stack_0000000c == 0xd1) {
      if (in_RDI->m_pHistoryEntry != (char *)0x0) {
        pcVar6 = TStaticRingBuffer<char,_65536,_1>::Next
                           ((TStaticRingBuffer<char,_65536,_1> *)in_stack_ffffffffffffff20,
                            in_stack_ffffffffffffff18);
        in_RDI->m_pHistoryEntry = pcVar6;
      }
      if (in_RDI->m_pHistoryEntry == (char *)0x0) {
        CLineInput::Clear((CLineInput *)in_stack_ffffffffffffff20);
      }
      else {
        CLineInput::Set((CLineInput *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      }
      bVar9 = true;
      goto LAB_00155abd;
    }
    if (in_stack_0000000c != 9) {
      if (in_stack_0000000c == 0xcb) {
        in_RDI->m_BacklogActPage = in_RDI->m_BacklogActPage + 1;
      }
      else if ((in_stack_0000000c == 0xce) &&
              (in_RDI->m_BacklogActPage = in_RDI->m_BacklogActPage + -1,
              in_RDI->m_BacklogActPage < 0)) {
        in_RDI->m_BacklogActPage = 0;
      }
      goto LAB_00155abd;
    }
    pIVar8 = CGameClient::Input((in_RDI->m_pGameConsole->super_CComponent).m_pClient);
    uVar2 = (*(pIVar8->super_IInterface)._vptr_IInterface[4])(pIVar8,0x161);
    in_stack_ffffffffffffff4f = 1;
    if ((uVar2 & 1) == 0) {
      pIVar8 = CGameClient::Input((in_RDI->m_pGameConsole->super_CComponent).m_pClient);
      iVar5 = (*(pIVar8->super_IInterface)._vptr_IInterface[4])(pIVar8,0x165);
      in_stack_ffffffffffffff4f = (byte)iVar5;
    }
    iVar5 = 1;
    if ((in_stack_ffffffffffffff4f & 1) != 0) {
      iVar5 = -1;
    }
    if (in_RDI->m_Type == 0) {
LAB_001557be:
      in_stack_ffffffffffffff4e = 0;
      if (in_RDI->m_Type == 1) {
        pIVar7 = CComponent::Client((CComponent *)0x1557e3);
        uVar2 = (*(pIVar7->super_IInterface)._vptr_IInterface[0x1a])();
        in_stack_ffffffffffffff4e = 0;
        if ((uVar2 & 1) != 0) {
          pIVar7 = CComponent::Client((CComponent *)0x15580f);
          iVar3 = (*(pIVar7->super_IInterface)._vptr_IInterface[0x1b])();
          in_stack_ffffffffffffff4e = (byte)iVar3;
        }
      }
      bVar11 = in_stack_ffffffffffffff4e & 1;
      pIVar10 = in_RDI->m_pGameConsole->m_pConsole;
      iVar3 = (*(pIVar10->super_IInterface)._vptr_IInterface[5])
                        (pIVar10,in_RDI->m_aCompletionBuffer,
                         (ulong)(uint)in_RDI->m_CompletionFlagmask,(ulong)bVar11,
                         IConsole::EmptyPossibleCommandCallback,0);
      if (iVar3 == 0) {
        if (in_RDI->m_CompletionChosen != -1) {
          in_RDI->m_CompletionChosen = -1;
          Reset(in_RDI);
        }
      }
      else {
        if ((in_RDI->m_CompletionChosen == -1) && (iVar5 < 0)) {
          in_RDI->m_CompletionChosen = 0;
        }
        in_RDI->m_CompletionChosen = (in_RDI->m_CompletionChosen + iVar5 + iVar3) % iVar3;
        pIVar10 = in_RDI->m_pGameConsole->m_pConsole;
        (*(pIVar10->super_IInterface)._vptr_IInterface[5])
                  (pIVar10,in_RDI->m_aCompletionBuffer,(ulong)(uint)in_RDI->m_CompletionFlagmask,
                   (ulong)bVar11,PossibleCommandsCompleteCallback);
      }
    }
    else {
      pIVar7 = CComponent::Client((CComponent *)0x1557a9);
      uVar2 = (*(pIVar7->super_IInterface)._vptr_IInterface[0x1a])();
      if ((uVar2 & 1) != 0) goto LAB_001557be;
    }
    if (in_RDI->m_Type == 1) {
      pIVar7 = CComponent::Client((CComponent *)0x155950);
      uVar2 = (*(pIVar7->super_IInterface)._vptr_IInterface[0x1a])();
      if ((uVar2 & 1) != 0) {
        GetString((CInstance *)0x15596f);
        bVar1 = IsMapCommandPrefix(in_stack_ffffffffffffff18);
        if (bVar1) {
          pIVar10 = in_RDI->m_pGameConsole->m_pConsole;
          iVar3 = (*(pIVar10->super_IInterface)._vptr_IInterface[6])
                            (pIVar10,in_RDI->m_aCompletionMapBuffer,
                             IConsole::EmptyPossibleCommandCallback,0);
          if (iVar3 == 0) {
            if (in_RDI->m_CompletionMapChosen != -1) {
              in_RDI->m_CompletionMapChosen = -1;
              Reset(in_RDI);
            }
          }
          else {
            if ((in_RDI->m_CompletionMapChosen == -1) && (iVar5 < 0)) {
              in_RDI->m_CompletionMapChosen = 0;
            }
            in_RDI->m_CompletionMapChosen = (in_RDI->m_CompletionMapChosen + iVar5 + iVar3) % iVar3;
            pIVar10 = in_RDI->m_pGameConsole->m_pConsole;
            (*(pIVar10->super_IInterface)._vptr_IInterface[6])
                      (pIVar10,in_RDI->m_aCompletionMapBuffer,PossibleMapsCompleteCallback);
          }
        }
      }
    }
    goto LAB_00155abd;
  }
  pcVar6 = CLineInput::GetString(&in_RDI->m_Input);
  if (*pcVar6 != '\0') {
    if (in_RDI->m_Type == 0) {
LAB_001554ec:
      in_stack_ffffffffffffff50 = (CLineInput *)&in_RDI->m_History;
      CLineInput::GetLength(&in_RDI->m_Input);
      TStaticRingBuffer<char,_65536,_1>::Allocate
                ((TStaticRingBuffer<char,_65536,_1> *)in_stack_ffffffffffffff20,
                 (int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
      CLineInput::GetString(&in_RDI->m_Input);
      CLineInput::GetLength(&in_RDI->m_Input);
      mem_copy(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,0);
    }
    else {
      pIVar7 = CComponent::Client((CComponent *)0x1554da);
      uVar2 = (*(pIVar7->super_IInterface)._vptr_IInterface[0x1a])();
      if ((uVar2 & 1) != 0) goto LAB_001554ec;
    }
    CLineInput::GetString(&in_RDI->m_Input);
    ExecuteLine(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    CLineInput::Clear((CLineInput *)in_stack_ffffffffffffff20);
    in_RDI->m_pHistoryEntry = (char *)0x0;
  }
  bVar9 = true;
LAB_00155abd:
  if (!bVar9) {
    CLineInput::ProcessInput
              (in_stack_ffffffffffffff50,
               (CEvent *)
               CONCAT17(in_stack_ffffffffffffff4f,
                        CONCAT16(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48)));
  }
  if ((in_stack_00000008 & 9) != 0) {
    if (((in_stack_0000000c != 9) && (in_stack_0000000c != 0x161)) && (in_stack_0000000c != 0x165))
    {
      in_RDI->m_CompletionChosen = -1;
      CLineInput::GetString(&in_RDI->m_Input);
      str_copy((char *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,0);
      for (local_6c = 0; local_6c < 2; local_6c = local_6c + 1) {
        GetString((CInstance *)0x155b7e);
        pcVar6 = str_startswith_nocase
                           ((char *)CONCAT17(in_stack_ffffffffffffff2f,
                                             CONCAT16(in_stack_ffffffffffffff2e,
                                                      CONCAT24(in_stack_ffffffffffffff2c,
                                                               in_stack_ffffffffffffff28))),
                            (char *)in_stack_ffffffffffffff20);
        if (pcVar6 != (char *)0x0) {
          in_RDI->m_CompletionMapChosen = -1;
          CLineInput::GetString(&in_RDI->m_Input);
          str_length((char *)0x155be1);
          str_copy((char *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,0);
        }
      }
      Reset(in_RDI);
    }
    local_78 = GetString((CInstance *)0x155c20);
    local_7c = 0;
    while( true ) {
      bVar9 = false;
      if ((local_7c < 0x2f) && (bVar9 = false, *local_78 != '\0')) {
        bVar9 = *local_78 != ' ';
      }
      if (!bVar9) break;
      local_38[local_7c] = *local_78;
      local_7c = local_7c + 1;
      local_78 = local_78 + 1;
    }
    local_38[local_7c] = '\0';
    pIVar10 = in_RDI->m_pGameConsole->m_pConsole;
    pcVar6 = local_38;
    uVar2 = in_RDI->m_CompletionFlagmask;
    bVar11 = 0;
    if (in_RDI->m_Type == 1) {
      pIVar7 = CComponent::Client((CComponent *)0x155cec);
      uVar4 = (*(pIVar7->super_IInterface)._vptr_IInterface[0x1a])();
      bVar11 = 0;
      if ((uVar4 & 1) != 0) {
        pIVar7 = CComponent::Client((CComponent *)0x155d18);
        iVar5 = (*(pIVar7->super_IInterface)._vptr_IInterface[0x1b])();
        bVar11 = (byte)iVar5;
      }
    }
    iVar5 = (*(pIVar10->super_IInterface)._vptr_IInterface[4])
                      (pIVar10,pcVar6,(ulong)uVar2,(ulong)(bVar11 & 1));
    if (CONCAT44(extraout_var,iVar5) == 0) {
      in_RDI->m_IsCommand = false;
    }
    else {
      in_RDI->m_IsCommand = true;
      str_copy(pcVar6,(char *)pIVar10,0);
      str_copy(pcVar6,(char *)pIVar10,0);
      str_copy(pcVar6,(char *)pIVar10,0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CGameConsole::CInstance::OnInput(IInput::CEvent Event)
{
	bool Handled = false;

	if(Event.m_Flags&IInput::FLAG_PRESS)
	{
		if(Event.m_Key == KEY_RETURN || Event.m_Key == KEY_KP_ENTER)
		{
			if(m_Input.GetString()[0])
			{
				if(m_Type == CONSOLETYPE_LOCAL || m_pGameConsole->Client()->RconAuthed())
				{
					char *pEntry = m_History.Allocate(m_Input.GetLength()+1);
					mem_copy(pEntry, m_Input.GetString(), m_Input.GetLength()+1);
				}
				ExecuteLine(m_Input.GetString());
				m_Input.Clear();
				m_pHistoryEntry = 0x0;
			}

			Handled = true;
		}
		else if(Event.m_Key == KEY_UP)
		{
			if(m_pHistoryEntry)
			{
				char *pTest = m_History.Prev(m_pHistoryEntry);

				if(pTest)
					m_pHistoryEntry = pTest;
			}
			else
				m_pHistoryEntry = m_History.Last();

			if(m_pHistoryEntry)
				m_Input.Set(m_pHistoryEntry);
			Handled = true;
		}
		else if(Event.m_Key == KEY_DOWN)
		{
			if(m_pHistoryEntry)
				m_pHistoryEntry = m_History.Next(m_pHistoryEntry);

			if(m_pHistoryEntry)
				m_Input.Set(m_pHistoryEntry);
			else
				m_Input.Clear();
			Handled = true;
		}
		else if(Event.m_Key == KEY_TAB)
		{
			const int Direction = m_pGameConsole->m_pClient->Input()->KeyIsPressed(KEY_LSHIFT) || m_pGameConsole->m_pClient->Input()->KeyIsPressed(KEY_RSHIFT) ? -1 : 1;

			// command completion
			if(m_Type == CGameConsole::CONSOLETYPE_LOCAL || m_pGameConsole->Client()->RconAuthed())
			{
				const bool UseTempCommands = m_Type == CGameConsole::CONSOLETYPE_REMOTE && m_pGameConsole->Client()->RconAuthed() && m_pGameConsole->Client()->UseTempRconCommands();
				const int CompletionEnumerationCount = m_pGameConsole->m_pConsole->PossibleCommands(m_aCompletionBuffer, m_CompletionFlagmask, UseTempCommands);
				if(CompletionEnumerationCount)
				{
					if(m_CompletionChosen == -1 && Direction < 0)
						m_CompletionChosen = 0;
					m_CompletionChosen = (m_CompletionChosen + Direction + CompletionEnumerationCount) % CompletionEnumerationCount;
					m_pGameConsole->m_pConsole->PossibleCommands(m_aCompletionBuffer, m_CompletionFlagmask, UseTempCommands, PossibleCommandsCompleteCallback, this);
				}
				else if(m_CompletionChosen != -1)
				{
					m_CompletionChosen = -1;
					Reset();
				}
			}

			// maplist completion
			if(m_Type == CGameConsole::CONSOLETYPE_REMOTE && m_pGameConsole->Client()->RconAuthed() && IsMapCommandPrefix(GetString()))
			{
				const int CompletionMapEnumerationCount = m_pGameConsole->m_pConsole->PossibleMaps(m_aCompletionMapBuffer);
				if(CompletionMapEnumerationCount)
				{
					if(m_CompletionMapChosen == -1 && Direction < 0)
						m_CompletionMapChosen = 0;
					m_CompletionMapChosen = (m_CompletionMapChosen + Direction + CompletionMapEnumerationCount) % CompletionMapEnumerationCount;
					m_pGameConsole->m_pConsole->PossibleMaps(m_aCompletionMapBuffer, PossibleMapsCompleteCallback, this);
				}
				else if(m_CompletionMapChosen != -1)
				{
					m_CompletionMapChosen = -1;
					Reset();
				}
			}
		}
		else if(Event.m_Key == KEY_PAGEUP)
		{
			++m_BacklogActPage;
		}
		else if(Event.m_Key == KEY_PAGEDOWN)
		{
			--m_BacklogActPage;
			if(m_BacklogActPage < 0)
				m_BacklogActPage = 0;
		}
	}

	if(!Handled)
		m_Input.ProcessInput(Event);

	if(Event.m_Flags&(IInput::FLAG_PRESS|IInput::FLAG_TEXT))
	{
		if(Event.m_Key != KEY_TAB && Event.m_Key != KEY_LSHIFT && Event.m_Key != KEY_RSHIFT)
		{
			m_CompletionChosen = -1;
			str_copy(m_aCompletionBuffer, m_Input.GetString(), sizeof(m_aCompletionBuffer));

			for(unsigned i = 0; i < sizeof(s_apMapCommands) / sizeof(char *); i++)
			{
				if(str_startswith_nocase(GetString(), s_apMapCommands[i]))
				{
					m_CompletionMapChosen = -1;
					str_copy(m_aCompletionMapBuffer, &m_Input.GetString()[str_length(s_apMapCommands[i])], sizeof(m_aCompletionBuffer));
				}
			}
			
			Reset();
		}

		// find the current command
		{
			char aBuf[sizeof(m_aCommandName)];
			const char *pSrc = GetString();
			int i = 0;
			for(; i < (int)sizeof(aBuf)-1 && *pSrc && *pSrc != ' '; i++, pSrc++)
				aBuf[i] = *pSrc;
			aBuf[i] = 0;

			const IConsole::CCommandInfo *pCommand = m_pGameConsole->m_pConsole->GetCommandInfo(aBuf, m_CompletionFlagmask,
				m_Type == CGameConsole::CONSOLETYPE_REMOTE && m_pGameConsole->Client()->RconAuthed() && m_pGameConsole->Client()->UseTempRconCommands());
			if(pCommand)
			{
				m_IsCommand = true;
				str_copy(m_aCommandName, pCommand->m_pName, sizeof(m_aCommandName));
				str_copy(m_aCommandHelp, pCommand->m_pHelp, sizeof(m_aCommandHelp));
				str_copy(m_aCommandParams, pCommand->m_pParams, sizeof(m_aCommandParams));
			}
			else
				m_IsCommand = false;
		}
	}
}